

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_mc2b(double *mc,double *b,int m,double a)

{
  ulong uVar1;
  
  if (mc == b) {
    if ((a != 0.0) || (NAN(a))) {
      for (uVar1 = (ulong)(uint)m; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
        b[uVar1 - 1] = b[uVar1] * -a + b[uVar1 - 1];
      }
    }
  }
  else {
    if ((a == 0.0) && (!NAN(a))) {
      HTS_movem(mc,b,m + 1);
      return;
    }
    b[m] = mc[m];
    for (uVar1 = (ulong)(uint)m; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      b[uVar1 - 1] = b[uVar1] * -a + mc[uVar1 - 1];
    }
  }
  return;
}

Assistant:

static void HTS_mc2b(double *mc, double *b, int m, const double a)
{
   if (mc != b) {
      if (a != 0.0) {
         b[m] = mc[m];
         for (m--; m >= 0; m--)
            b[m] = mc[m] - a * b[m + 1];
      } else
         HTS_movem(mc, b, m + 1);
   } else if (a != 0.0)
      for (m--; m >= 0; m--)
         b[m] -= a * b[m + 1];
}